

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLineStripPointsIndiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  long lVar1;
  uint uVar2;
  AdjacencyGrid *pAVar3;
  AdjacencyGridPoint *pAVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  GLfloat *pGVar8;
  GLfloat *pGVar9;
  uint *puVar10;
  GLfloat *pGVar11;
  GLfloat *pGVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  
  pAVar3 = test_data->m_grid;
  uVar2 = (pAVar3->m_line_strip).m_n_points;
  uVar13 = (ulong)uVar2;
  test_data->m_n_vertices = uVar2;
  uVar18 = (uVar2 * 8 + -0x18) * this->m_n_components_output;
  test_data->m_geometry_bo_size = uVar18;
  uVar19 = uVar2 * 4;
  uVar17 = this->m_n_components_input * uVar19;
  test_data->m_vertex_data_bo_size = uVar17;
  test_data->m_index_data_bo_size = uVar19;
  pGVar8 = (GLfloat *)operator_new__((ulong)uVar18);
  test_data->m_expected_adjacency_geometry = pGVar8;
  pGVar9 = (GLfloat *)operator_new__((ulong)uVar18);
  test_data->m_expected_geometry = pGVar9;
  puVar10 = (uint *)operator_new__((ulong)uVar19);
  test_data->m_index_data = puVar10;
  pGVar11 = (GLfloat *)operator_new__((ulong)uVar17);
  test_data->m_vertex_data = pGVar11;
  uVar17 = 0xfffffffd;
  if (uVar13 != 0) {
    pGVar12 = &((pAVar3->m_line_strip).m_points)->y;
    uVar15 = 0;
    do {
      pGVar11[uVar15 * 2] = pGVar12[-1];
      pGVar11[uVar15 * 2 + 1] = *pGVar12;
      auVar7 = _DAT_01a25df0;
      auVar6 = _DAT_019fcc00;
      auVar5 = _DAT_019f5ce0;
      uVar15 = uVar15 + 1;
      pGVar12 = pGVar12 + 3;
    } while (uVar13 != uVar15);
    if (uVar13 != 0) {
      lVar16 = uVar13 - 1;
      auVar20._8_4_ = (int)lVar16;
      auVar20._0_8_ = lVar16;
      auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
      uVar17 = uVar2 - 1;
      uVar15 = 0;
      auVar20 = auVar20 ^ _DAT_019f5ce0;
      do {
        uVar18 = (uint)uVar15;
        auVar22._8_4_ = uVar18;
        auVar22._0_8_ = uVar15;
        auVar22._12_4_ = (int)(uVar15 >> 0x20);
        auVar23 = (auVar22 | auVar6) ^ auVar5;
        iVar21 = auVar20._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar21 && auVar20._0_4_ < auVar23._0_4_ ||
                    iVar21 < auVar23._4_4_) & 1)) {
          puVar10[uVar15] = uVar17;
        }
        if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
            auVar23._12_4_ <= auVar20._12_4_) {
          puVar10[uVar15 + 1] = (uVar18 ^ 0xfffffffe) + uVar2;
        }
        auVar22 = (auVar22 | auVar7) ^ auVar5;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar21 && (iVar24 != iVar21 || auVar22._0_4_ <= auVar20._0_4_)) {
          puVar10[uVar15 + 2] = (uVar18 ^ 0xfffffffd) + uVar2;
          puVar10[uVar15 + 3] = (uVar18 ^ 0xfffffffc) + uVar2;
        }
        uVar15 = uVar15 + 4;
        uVar17 = uVar17 - 4;
      } while ((uVar13 + 3 & 0xfffffffffffffffc) != uVar15);
      uVar17 = uVar2 - 3;
      if (uVar17 == 0) {
        return;
      }
    }
  }
  pAVar4 = (pAVar3->m_line_strip).m_points;
  uVar15 = 3;
  lVar16 = 0;
  uVar13 = (ulong)*puVar10;
  do {
    uVar14 = (ulong)puVar10[uVar15 - 2];
    uVar2 = puVar10[(int)uVar15 - 1];
    uVar18 = puVar10[uVar15 & 0xffffffff];
    *(GLfloat *)((long)pGVar8 + lVar16) = pAVar4[uVar13].x;
    *(GLfloat *)((long)pGVar8 + lVar16 + 4) = pAVar4[uVar13].y;
    *(undefined8 *)((long)pGVar8 + lVar16 + 8) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar8 + lVar16 + 0x10) = pAVar4[uVar18].x;
    *(GLfloat *)((long)pGVar8 + lVar16 + 0x14) = pAVar4[uVar18].y;
    *(undefined8 *)((long)pGVar8 + lVar16 + 0x18) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar9 + lVar16) = pAVar4[uVar14].x;
    *(GLfloat *)((long)pGVar9 + lVar16 + 4) = pAVar4[uVar14].y;
    *(undefined8 *)((long)pGVar9 + lVar16 + 8) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar9 + lVar16 + 0x10) = pAVar4[uVar2].x;
    *(GLfloat *)((long)pGVar9 + lVar16 + 0x14) = pAVar4[uVar2].y;
    *(undefined8 *)((long)pGVar9 + lVar16 + 0x18) = 0x3f80000000000000;
    lVar1 = uVar15 - uVar17;
    uVar15 = uVar15 + 1;
    lVar16 = lVar16 + 0x20;
    uVar13 = uVar14;
  } while (lVar1 != 2);
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLineStripPointsIndiced(AdjacencyTestData& test_data)
{

	float*		  travellerExpectedAdjacencyGeometryPtr = 0;
	float*		  travellerExpectedGeometryPtr			= 0;
	unsigned int* travellerIndicesPtr					= 0;
	float*		  travellerPtr							= 0;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_line_strip.m_n_points;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>((test_data.m_n_vertices - 3) * m_n_components_output *
															2 /* start/end */ * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input * sizeof(float));
	test_data.m_index_data_bo_size = static_cast<glw::GLuint>(test_data.m_n_vertices * sizeof(unsigned int));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_index_data					= new unsigned int[test_data.m_index_data_bo_size / sizeof(unsigned int)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerIndicesPtr					  = test_data.m_index_data;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected value s*/
	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerIndicesPtr = (test_data.m_n_vertices - n - 1);
		++travellerIndicesPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices - 3; ++n)
	{
		AdjacencyGridPoint* pointN0 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n];
		AdjacencyGridPoint* pointN1 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 1];
		AdjacencyGridPoint* pointN2 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 2];
		AdjacencyGridPoint* pointN3 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 3];

		*travellerExpectedAdjacencyGeometryPtr = pointN0->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN0->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN3->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN3->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = pointN1->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN1->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN2->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN2->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all vertices apart from the three last ones) */
}